

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall cmDocumentation::addCMakeStandardDocSections(cmDocumentation *this)

{
  cmDocumentationSection sec;
  cmDocumentationSection local_40;
  
  cmDocumentationSection::cmDocumentationSection(&local_40,"Generators");
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
            (&local_40.Entries,
             (value_type *)(anonymous_namespace)::cmDocumentationCMakeGeneratorsHeader);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
  ::_M_emplace_unique<char_const(&)[11],cmDocumentationSection>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
              *)&this->AllSections,(char (*) [11])0x6d7d23,&local_40);
  cmDocumentationSection::~cmDocumentationSection(&local_40);
  return;
}

Assistant:

void cmDocumentation::addCMakeStandardDocSections()
{
  cmDocumentationSection sec{ "Generators" };
  sec.Append(cmDocumentationCMakeGeneratorsHeader);
  this->AllSections.emplace("Generators", std::move(sec));
}